

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManPrintMatches(Nf_Man_t *p)

{
  Nf_Obj_t *pNVar1;
  Gia_Obj_t *pGVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = 0x38;
  uVar4 = 0;
  while( true ) {
    if ((long)p->pGia->nObjs <= (long)uVar4) {
      return;
    }
    pGVar2 = Gia_ManObj(p->pGia,(int)uVar4);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
      pNVar1 = p->pNfObjs;
      printf("%5d : ",uVar4 & 0xffffffff);
      printf("Dp = %6.2f  ",
             (double)((float)*(int *)((long)(pNVar1->M + -2) + 0x10 + lVar3) / 1000.0));
      printf("Dn = %6.2f  ",
             (double)((float)*(int *)((long)(pNVar1->M + -1) + 0x10 + lVar3) / 1000.0));
      printf("  ");
      printf("Ap = %6.2f  ",(double)((float)*(int *)((long)(pNVar1->M + -1) + lVar3) / 1000.0));
      printf("An = %6.2f  ",(double)((float)*(int *)(&pNVar1->M[0][0].field_0x0 + lVar3) / 1000.0));
      printf("  ");
      printf("Dp = %8s ",
             p->pCells[(ulong)*(uint *)((long)(pNVar1->M + -2) + 8 + lVar3) & 0xfffff].pName);
      printf("Dn = %8s ",
             p->pCells[(ulong)*(uint *)((long)(pNVar1->M + -1) + 8 + lVar3) & 0xfffff].pName);
      printf("Ap = %8s ",
             p->pCells[(ulong)*(uint *)((long)(pNVar1->M + -2) + 0x18 + lVar3) & 0xfffff].pName);
      printf("An = %8s ",
             p->pCells[(ulong)*(uint *)((long)(pNVar1->M + -1) + 0x18 + lVar3) & 0xfffff].pName);
      putchar(10);
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x40;
  }
  return;
}

Assistant:

void Nf_ManPrintMatches( Nf_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        Nf_Mat_t * pDp = Nf_ObjMatchD( p, i, 0 );
        Nf_Mat_t * pAp = Nf_ObjMatchA( p, i, 0 );
        Nf_Mat_t * pDn = Nf_ObjMatchD( p, i, 1 );
        Nf_Mat_t * pAn = Nf_ObjMatchA( p, i, 1 );

        printf( "%5d : ", i );
        printf( "Dp = %6.2f  ", Scl_Int2Flt(pDp->D) );
        printf( "Dn = %6.2f  ", Scl_Int2Flt(pDn->D) );
        printf( "  " );
        printf( "Ap = %6.2f  ", Scl_Int2Flt(pAp->D) );
        printf( "An = %6.2f  ", Scl_Int2Flt(pAn->D) );
        printf( "  " );
        printf( "Dp = %8s ", Nf_ManCell(p, pDp->Gate)->pName );
        printf( "Dn = %8s ", Nf_ManCell(p, pDn->Gate)->pName );
        printf( "Ap = %8s ", Nf_ManCell(p, pAp->Gate)->pName );
        printf( "An = %8s ", Nf_ManCell(p, pAn->Gate)->pName );
        printf( "\n" );

    }
}